

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.h
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* ispring::File::FileList
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *dir_path,string *ext,bool recursive)

{
  char cVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  dirent *pdVar8;
  size_t sVar9;
  undefined7 in_register_00000009;
  uint uVar10;
  ulong uVar11;
  size_type *psVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *temp;
  size_type sVar13;
  value_type *pvVar14;
  value_type *__x;
  bool bVar15;
  bool bVar16;
  string str;
  string path_ext;
  string str_exp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allow_ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string *local_120;
  undefined1 local_118 [36];
  undefined4 local_f4;
  DIR *local_f0;
  pointer local_e8;
  string *local_e0;
  long *local_d8 [2];
  long local_c8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string local_98;
  value_type *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f4 = (undefined4)CONCAT71(in_register_00000009,recursive);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar1 = (dir_path->_M_dataplus)._M_p[dir_path->_M_string_length - 1];
  local_120 = dir_path;
  if ((cVar1 != '/') && (cVar1 != '\\')) {
    std::__cxx11::string::push_back((char)dir_path);
  }
  local_d8[0] = local_c8;
  pcVar2 = (local_120->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,pcVar2,pcVar2 + local_120->_M_string_length);
  std::__cxx11::string::append((char *)local_d8);
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = ext;
  if (ext->_M_string_length != 0) {
    uVar11 = 0;
    do {
      std::__cxx11::string::find((char)ext,0x3b);
      std::__cxx11::string::substr((ulong)&local_140,(ulong)ext);
      sVar4 = local_140._M_string_length;
      _Var3._M_p = local_140._M_dataplus._M_p;
      if (local_140._M_string_length != 0) {
        sVar13 = 0;
        do {
          iVar7 = toupper((int)_Var3._M_p[sVar13]);
          _Var3._M_p[sVar13] = (char)iVar7;
          sVar13 = sVar13 + 1;
        } while (sVar4 != sVar13);
      }
      sVar4 = local_140._M_string_length;
      std::__cxx11::string::rfind((char)&local_140,0x2e);
      std::__cxx11::string::substr((ulong)local_118,(ulong)&local_140);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
      ext = local_e0;
      if ((value_type *)local_118._0_8_ != (value_type *)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      uVar11 = uVar11 + sVar4 + 1;
    } while (uVar11 < ext->_M_string_length);
  }
  local_f0 = opendir((local_120->_M_dataplus)._M_p);
  if (local_f0 != (DIR *)0x0) {
    while( true ) {
      pdVar8 = readdir(local_f0);
      if (pdVar8 == (dirent *)0x0) break;
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      sVar9 = strlen(pdVar8->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,pdVar8->d_name,pdVar8->d_name + sVar9);
      if (pdVar8->d_type == '\b') {
        std::__cxx11::string::rfind((char)&local_140,0x2e);
        std::__cxx11::string::substr((ulong)local_118,(ulong)&local_140);
        uVar6 = local_118._8_8_;
        uVar5 = local_118._0_8_;
        if ((value_type *)local_118._8_8_ != (value_type *)0x0) {
          pvVar14 = (value_type *)0x0;
          do {
            iVar7 = toupper((int)*(char *)(uVar5 + (long)pvVar14));
            *(char *)(uVar5 + (long)pvVar14) = (char)iVar7;
            pvVar14 = (value_type *)((long)&(pvVar14->_M_dataplus)._M_p + 1);
          } while ((value_type *)uVar6 != pvVar14);
        }
        uVar5 = local_118._8_8_;
        local_e8 = local_b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (uint)((ulong)((long)local_b8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_b8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
        bVar15 = 0 < (int)uVar10;
        if (0 < (int)uVar10) {
          local_78 = (value_type *)local_118._0_8_;
          psVar12 = &(local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
          uVar11 = 1;
          do {
            pvVar14 = (value_type *)*psVar12;
            if ((pvVar14 == (value_type *)uVar5) &&
               ((pvVar14 == (value_type *)0x0 ||
                (iVar7 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(psVar12 + -1))->_M_dataplus)._M_p,local_78,(size_t)pvVar14),
                iVar7 == 0)))) {
              if (bVar15) goto LAB_001356ba;
              break;
            }
            bVar15 = uVar11 < (uVar10 & 0x7fffffff);
            psVar12 = psVar12 + 4;
            bVar16 = uVar11 != (uVar10 & 0x7fffffff);
            uVar11 = uVar11 + 1;
          } while (bVar16);
        }
        iVar7 = std::__cxx11::string::compare((char *)local_e8);
        if (iVar7 == 0) {
LAB_001356ba:
          std::operator+(&local_50,local_120,&local_140);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        ext = local_e0;
        if ((value_type *)local_118._0_8_ != (value_type *)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
          ext = local_e0;
        }
      }
      else if ((((char)local_f4 != '\0') &&
               (iVar7 = std::__cxx11::string::compare((char *)&local_140), iVar7 != 0)) &&
              (iVar7 = std::__cxx11::string::compare((char *)&local_140), iVar7 != 0)) {
        std::operator+(&local_70,local_120,&local_140);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        pcVar2 = (ext->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar2,pcVar2 + ext->_M_string_length);
        FileList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_118,&local_70,&local_98,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        __x = (value_type *)local_118._0_8_;
        pvVar14 = (value_type *)local_118._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          __x = (value_type *)local_118._0_8_;
          pvVar14 = (value_type *)local_118._8_8_;
        }
        for (; __x != pvVar14; __x = __x + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,__x);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_118);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
    }
    closedir(local_f0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> FileList(std::string dir_path, std::string ext, bool recursive = false) {
			std::vector<std::string> paths; //return value
			if (dir_path.back() != '/' && dir_path.back() != '\\') {
				dir_path.push_back('/');
			}
			std::string str_exp = dir_path + "*.*";
			std::vector<std::string> allow_ext;
			std::string::size_type offset = 0;
			while (offset < ext.length()) {
				std::string str = ext.substr(offset, ext.find(';', offset) - offset);
				std::transform(str.begin(), str.end(), str.begin(), toupper);
				offset += str.length() + 1;
				std::string::size_type pos = str.find_last_of('.');
				pos = pos == std::string::npos ? 0 : pos + 1;
				allow_ext.push_back(str.substr(pos, str.length()));
			}
			DIR* fd=opendir(dir_path.c_str());
			if (fd == NULL) {
				return paths;
			}
			struct dirent* hFind=NULL;
			while(hFind=readdir(fd)){
				std::string path = hFind->d_name;
				if(hFind->d_type==DT_REG) {    //is File?
					std::string path_ext = path.substr(path.find_last_of('.') + 1, path.length());  //파일의 확장자 추출
					std::transform(path_ext.begin(), path_ext.end(), path_ext.begin(), toupper);
					int i = -1;
					while (++i < (int) allow_ext.size() && allow_ext[i] != path_ext);
					if (i < (int) allow_ext.size() || allow_ext.front() == "*") {    //allow_ext에 포함되어있으면
						paths.push_back(dir_path + path);
					}
				}else if (recursive == true && path != "." && path != "..") {	//is Directory?
					std::vector<std::string> temps = FileList(dir_path + path, ext, recursive);
					for (auto&temp : temps) {
						paths.push_back(temp);
					}
				}
			}
			closedir(fd);
			return paths;   //RVO
		}